

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O1

void __thiscall
Impl2T<poly::virtual_cloning_policy>::function(Impl2T<poly::virtual_cloning_policy> *this)

{
  Impl1 local_48;
  
  LOCK();
  UNLOCK();
  local_48.super_Interface.my_id =
       (size_t)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
  local_48.super_Interface.throw_on_copy_construction = false;
  local_48.super_Interface._vptr_Interface = (_func_int **)&PTR_function_002bf7a8;
  local_48.d = 3.1;
  Interface::last_id.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  local_48.p._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)operator_new__(0x1bc)
  ;
  local_48.cookie.cookie = 0xdeadbeef;
  poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::push_back<Impl1>
            (&this->v,&local_48);
  local_48.super_Interface._vptr_Interface = (_func_int **)&PTR_function_002bf7a8;
  Cookie::~Cookie(&local_48.cookie);
  if ((_Head_base<0UL,_int_*,_false>)
      local_48.p._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_48.p._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

explicit Interface(bool throw_on_copy = false)
        : my_id { last_id++ }
        , throw_on_copy_construction { throw_on_copy }
    {
    }